

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall ACSStringPool::MarkStringMap(ACSStringPool *this,FWorldGlobalArray *aray)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  ConstPair *pair;
  ConstIterator it;
  ConstPair *local_30;
  TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_> local_28;
  
  local_28.Position = 0;
  local_28.Map = aray;
  while( true ) {
    bVar2 = TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>::NextPair
                      (&local_28,&local_30);
    if (!bVar2) break;
    if (((local_30->Value & 0xfff00000U) == 0x7ff00000) &&
       (uVar3 = local_30->Value & 0xfffff, uVar3 < (this->Pool).Count)) {
      puVar1 = &(this->Pool).Array[uVar3].LockCount;
      *puVar1 = *puVar1 | 0x80000000;
    }
  }
  return;
}

Assistant:

void ACSStringPool::MarkStringMap(const FWorldGlobalArray &aray)
{
	FWorldGlobalArray::ConstIterator it(aray);
	FWorldGlobalArray::ConstPair *pair;

	while (it.NextPair(pair))
	{
		int num = pair->Value;
		if ((num & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR)
		{
			num &= ~LIBRARYID_MASK;
			if ((unsigned)num < Pool.Size())
			{
				Pool[num].LockCount |= 0x80000000;
			}
		}
	}
}